

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_validator(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  uint uVar3;
  ostream *poVar4;
  t_type *ttype;
  reference pptVar5;
  string *psVar6;
  string local_188;
  string local_168;
  string local_148;
  t_struct *local_128;
  t_type *type;
  t_field **local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  t_field **local_68;
  string local_50;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public void validate() throws org.apache.thrift.TException {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"// check for required fields");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  local_68 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_68;
  while( true ) {
    local_70._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_70);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    eVar2 = t_field::get_req(*pptVar5);
    if (eVar2 == T_REQUIRED) {
      if ((this->bean_style_ & 1U) == 0) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        ttype = t_field::get_type(*pptVar5);
        bVar1 = type_can_be_null(this,ttype);
        if (bVar1) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"if (");
          pptVar5 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_30);
          psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
          poVar4 = std::operator<<(poVar4,(string *)psVar6);
          poVar4 = std::operator<<(poVar4," == null) {");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,
                                   "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field \'"
                                  );
          pptVar5 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_30);
          psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
          poVar4 = std::operator<<(poVar4,(string *)psVar6);
          poVar4 = std::operator<<(poVar4,"\' was not present! Struct: \" + toString());");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"}");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
        else {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"// alas, we cannot check \'");
          pptVar5 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_30);
          psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
          poVar4 = std::operator<<(poVar4,(string *)psVar6);
          poVar4 = std::operator<<(poVar4,
                                   "\' because it\'s a primitive and you chose the non-beans generator."
                                  );
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_90);
        poVar4 = std::operator<<(poVar4,"if (!");
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        generate_isset_check_abi_cxx11_(&local_b0,this,*pptVar5);
        poVar4 = std::operator<<(poVar4,(string *)&local_b0);
        poVar4 = std::operator<<(poVar4,") {");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4,
                                 "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field \'"
                                );
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_30);
        psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
        poVar4 = std::operator<<(poVar4,(string *)psVar6);
        poVar4 = std::operator<<(poVar4,"\' is unset! Struct:\" + toString());");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
        poVar4 = std::operator<<(poVar4,(string *)&local_f0);
        poVar4 = std::operator<<(poVar4,"}");
        poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_110);
  poVar4 = std::operator<<(poVar4,"// check for sub-struct validity");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  local_118 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_118;
  while( true ) {
    type = (t_type *)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&type);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    local_128 = (t_struct *)t_field::get_type(*pptVar5);
    uVar3 = (*(local_128->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) != 0) && (bVar1 = t_struct::is_union(local_128), !bVar1)) {
      t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_148);
      poVar4 = std::operator<<(poVar4,"if (");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4," != null) {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_148);
      t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_168);
      poVar4 = std::operator<<(poVar4,"  ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_30);
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
      poVar4 = std::operator<<(poVar4,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,".validate();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_168);
      t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_188);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_188);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public void validate() throws org.apache.thrift.TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      if (bean_style_) {
        out << indent() << "if (!" << generate_isset_check(*f_iter) << ") {" << endl << indent()
            << "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field '"
            << (*f_iter)->get_name() << "' is unset! Struct:\" + toString());" << endl << indent()
            << "}" << endl << endl;
      } else {
        if (type_can_be_null((*f_iter)->get_type())) {
          indent(out) << "if (" << (*f_iter)->get_name() << " == null) {" << endl;
          indent(out)
              << "  throw new org.apache.thrift.protocol.TProtocolException(\"Required field '"
              << (*f_iter)->get_name() << "' was not present! Struct: \" + toString());" << endl;
          indent(out) << "}" << endl;
        } else {
          indent(out) << "// alas, we cannot check '" << (*f_iter)->get_name()
                      << "' because it's a primitive and you chose the non-beans generator."
                      << endl;
        }
      }
    }
  }

  out << indent() << "// check for sub-struct validity" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_type* type = (*f_iter)->get_type();
    if (type->is_struct() && !((t_struct*)type)->is_union()) {
      out << indent() << "if (" << (*f_iter)->get_name() << " != null) {" << endl;
      out << indent() << "  " << (*f_iter)->get_name() << ".validate();" << endl;
      out << indent() << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}